

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O0

DdNode * Llb_ManConstructQuantCubeIntern(Llb_Man_t *p,Llb_Grp_t *pGroup,int iGrpPlace,int fBackward)

{
  abctime aVar1;
  Vec_Int_t *pVVar2;
  DdManager *pDVar3;
  int iVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  DdNode *pDVar7;
  abctime TimeStop;
  int iGroupLast;
  int iGroupFirst;
  int i;
  DdNode *bVar;
  DdNode *bTemp;
  DdNode *bRes;
  Aig_Obj_t *pObj;
  int fBackward_local;
  int iGrpPlace_local;
  Llb_Grp_t *pGroup_local;
  Llb_Man_t *p_local;
  
  aVar1 = p->dd->TimeStop;
  p->dd->TimeStop = 0;
  bTemp = Cudd_ReadOne(p->dd);
  Cudd_Ref(bTemp);
  for (iGroupLast = 0; iVar4 = Vec_PtrSize(pGroup->vIns), iGroupLast < iVar4;
      iGroupLast = iGroupLast + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vIns,iGroupLast);
    if ((fBackward == 0) || (iVar4 = Saig_ObjIsPi(p->pAig,pAVar6), iVar4 == 0)) {
      pVVar2 = p->vVarBegs;
      iVar4 = Aig_ObjId(pAVar6);
      iVar4 = Vec_IntEntry(pVVar2,iVar4);
      pVVar2 = p->vVarEnds;
      iVar5 = Aig_ObjId(pAVar6);
      iVar5 = Vec_IntEntry(pVVar2,iVar5);
      if (iVar5 < iVar4) {
        __assert_fail("iGroupFirst <= iGroupLast",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                      ,0xa9,
                      "DdNode *Llb_ManConstructQuantCubeIntern(Llb_Man_t *, Llb_Grp_t *, int, int)")
        ;
      }
      if (iVar5 <= iVar4) {
        pDVar3 = p->dd;
        pVVar2 = p->vObj2Var;
        iVar4 = Aig_ObjId(pAVar6);
        iVar4 = Vec_IntEntry(pVVar2,iVar4);
        pDVar7 = Cudd_bddIthVar(pDVar3,iVar4);
        pDVar7 = Cudd_bddAnd(p->dd,bTemp,pDVar7);
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(p->dd,bTemp);
        bTemp = pDVar7;
      }
    }
  }
  iGroupLast = 0;
  do {
    iVar4 = Vec_PtrSize(pGroup->vOuts);
    if (iVar4 <= iGroupLast) {
      Cudd_Deref(bTemp);
      p->dd->TimeStop = aVar1;
      return bTemp;
    }
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pGroup->vOuts,iGroupLast);
    if ((fBackward == 0) || (iVar4 = Saig_ObjIsPi(p->pAig,pAVar6), iVar4 == 0)) {
      pVVar2 = p->vVarBegs;
      iVar4 = Aig_ObjId(pAVar6);
      iVar4 = Vec_IntEntry(pVVar2,iVar4);
      pVVar2 = p->vVarEnds;
      iVar5 = Aig_ObjId(pAVar6);
      iVar5 = Vec_IntEntry(pVVar2,iVar5);
      if (iVar5 < iVar4) {
        __assert_fail("iGroupFirst <= iGroupLast",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                      ,0xb6,
                      "DdNode *Llb_ManConstructQuantCubeIntern(Llb_Man_t *, Llb_Grp_t *, int, int)")
        ;
      }
      if (iVar5 <= iVar4) {
        pDVar3 = p->dd;
        pVVar2 = p->vObj2Var;
        iVar4 = Aig_ObjId(pAVar6);
        iVar4 = Vec_IntEntry(pVVar2,iVar4);
        pDVar7 = Cudd_bddIthVar(pDVar3,iVar4);
        pDVar7 = Cudd_bddAnd(p->dd,bTemp,pDVar7);
        Cudd_Ref(pDVar7);
        Cudd_RecursiveDeref(p->dd,bTemp);
        bTemp = pDVar7;
      }
    }
    iGroupLast = iGroupLast + 1;
  } while( true );
}

Assistant:

DdNode * Llb_ManConstructQuantCubeIntern( Llb_Man_t * p, Llb_Grp_t * pGroup, int iGrpPlace, int fBackward )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bTemp, * bVar;
    int i, iGroupFirst, iGroupLast;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bRes = Cudd_ReadOne( p->dd );   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
    {
        if ( fBackward && Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        iGroupLast  = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGroupLast );
        if ( iGroupFirst < iGroupLast )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
    {
        if ( fBackward && Saig_ObjIsPi(p->pAig, pObj) )
            continue;
        iGroupFirst = Vec_IntEntry(p->vVarBegs, Aig_ObjId(pObj));
        iGroupLast  = Vec_IntEntry(p->vVarEnds, Aig_ObjId(pObj));
        assert( iGroupFirst <= iGroupLast );
        if ( iGroupFirst < iGroupLast )
            continue;
        bVar  = Cudd_bddIthVar( p->dd, Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj)) );
        bRes  = Cudd_bddAnd( p->dd, bTemp = bRes, bVar );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    Cudd_Deref( bRes );
    p->dd->TimeStop = TimeStop;
    return bRes;
}